

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  int *piVar6;
  void *__addr;
  ulong *puVar7;
  __sighandler_t p_Var8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _union_1457 _Var11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar12;
  _union_1457 *p_Var13;
  ulong uVar14;
  undefined8 uVar15;
  const_iterator cVar16;
  size_t __len;
  int pipe_fd [2];
  int death_test_index;
  string internal_flag;
  ExecDeathTestArgs args_2;
  Arguments args;
  string filter_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  ulong *local_318;
  long local_310;
  ulong local_308;
  long lStack_300;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  long lStack_2e0;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  long lStack_2c0;
  _union_1457 local_2b8;
  long local_2b0;
  _union_1457 local_2a8;
  long lStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string local_278;
  string local_258;
  int local_238;
  int local_234;
  string local_230;
  int local_20c;
  long *local_208;
  undefined8 local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  string local_1e8;
  string local_1c8;
  string local_1a0;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  _union_1457 local_160;
  undefined1 local_158 [8];
  ulong local_150;
  ulong uStack_148;
  _union_1457 local_c8;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [8];
  
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_20c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  iVar2 = pipe(&local_238);
  if (iVar2 == -1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    local_318 = (ulong *)*puVar5;
    puVar7 = puVar5 + 2;
    if (local_318 == puVar7) {
      local_308 = *puVar7;
      lStack_300 = puVar5[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar7;
    }
    local_310 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    local_2d8 = (ulong *)*puVar5;
    puVar7 = puVar5 + 2;
    if (local_2d8 == puVar7) {
      local_2c8 = *puVar7;
      lStack_2c0 = puVar5[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8 = *puVar7;
    }
    local_2d0 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_278._M_dataplus._M_p._0_4_ = 0x592;
    StreamableToString<int>((string *)&local_298,(int *)&local_278);
    uVar14 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar14 = local_2c8;
    }
    if (uVar14 < (ulong)(local_298._8_8_ + local_2d0)) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        uVar15 = local_288._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (ulong)(local_298._8_8_ + local_2d0)) goto LAB_0013732c;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_0013732c:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,local_298._M_allocated_capacity);
    }
    local_2b8.sa_handler = (__sighandler_t)*puVar5;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.sa_handler == paVar10) {
      local_2a8 = (_union_1457)paVar10->_M_allocated_capacity;
      lStack_2a0 = puVar5[3];
      local_2b8.sa_handler = (__sighandler_t)&local_2a8;
    }
    else {
      local_2a8 = (_union_1457)paVar10->_M_allocated_capacity;
    }
    local_2b0 = puVar5[1];
    *puVar5 = paVar10;
    puVar5[1] = 0;
    paVar10->_M_local_buf[0] = '\0';
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_160.sa_handler = (__sighandler_t)*puVar5;
    p_Var8 = (__sighandler_t)(puVar5 + 2);
    if (local_160.sa_handler == p_Var8) {
      local_150 = *(ulong *)p_Var8;
      uStack_148 = puVar5[3];
      local_160.sa_handler = (__sighandler_t)&local_150;
    }
    else {
      local_150 = *(ulong *)p_Var8;
    }
    local_158 = (undefined1  [8])puVar5[1];
    *puVar5 = p_Var8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
LAB_0013782d:
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
    local_c8.sa_handler = (__sighandler_t)*puVar5;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler != paVar10) goto LAB_001370f6;
    local_b8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar5[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
    goto LAB_00137101;
  }
  iVar2 = fcntl(local_234,2,0);
  if (iVar2 == -1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    local_318 = (ulong *)*puVar5;
    puVar7 = puVar5 + 2;
    if (local_318 == puVar7) {
      local_308 = *puVar7;
      lStack_300 = puVar5[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar7;
    }
    local_310 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    local_2d8 = (ulong *)*puVar5;
    puVar7 = puVar5 + 2;
    if (local_2d8 == puVar7) {
      local_2c8 = *puVar7;
      lStack_2c0 = puVar5[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8 = *puVar7;
    }
    local_2d0 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_278._M_dataplus._M_p._0_4_ = 0x595;
    StreamableToString<int>((string *)&local_298,(int *)&local_278);
    uVar14 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar14 = local_2c8;
    }
    if (uVar14 < (ulong)(local_298._8_8_ + local_2d0)) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        uVar15 = local_288._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (ulong)(local_298._8_8_ + local_2d0)) goto LAB_00137422;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_00137422:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,local_298._M_allocated_capacity);
    }
    local_2b8.sa_handler = (__sighandler_t)*puVar5;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.sa_handler == paVar10) {
      local_2a8 = (_union_1457)paVar10->_M_allocated_capacity;
      lStack_2a0 = puVar5[3];
      local_2b8.sa_handler = (__sighandler_t)&local_2a8;
    }
    else {
      local_2a8 = (_union_1457)paVar10->_M_allocated_capacity;
    }
    local_2b0 = puVar5[1];
    *puVar5 = paVar10;
    puVar5[1] = 0;
    paVar10->_M_local_buf[0] = '\0';
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_160.sa_handler = (__sighandler_t)*puVar5;
    p_Var8 = (__sighandler_t)(puVar5 + 2);
    if (local_160.sa_handler == p_Var8) {
      local_150 = *(ulong *)p_Var8;
      uStack_148 = puVar5[3];
      local_160.sa_handler = (__sighandler_t)&local_150;
    }
    else {
      local_150 = *(ulong *)p_Var8;
    }
    local_158 = (undefined1  [8])puVar5[1];
    *puVar5 = p_Var8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    goto LAB_0013782d;
  }
  local_2f8 = &local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"--","");
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_308 = *puVar7;
    lStack_300 = plVar4[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar7;
    local_318 = (ulong *)*plVar4;
  }
  local_310 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_318);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_2c8 = *puVar7;
    lStack_2c0 = plVar4[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar7;
    local_2d8 = (ulong *)*plVar4;
  }
  local_2d0 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  p_Var13 = (_union_1457 *)(plVar4 + 2);
  if ((_union_1457 *)*plVar4 == p_Var13) {
    local_2a8 = *p_Var13;
    lStack_2a0 = plVar4[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = *p_Var13;
    local_2b8.sa_handler = (__sighandler_t)*plVar4;
  }
  local_2b0 = plVar4[1];
  *plVar4 = (long)p_Var13;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_160.sa_handler = (__sighandler_t)&local_150;
  p_Var8 = (__sighandler_t)(plVar4 + 2);
  if ((__sighandler_t)*plVar4 == p_Var8) {
    local_150 = *(ulong *)p_Var8;
    uStack_148 = plVar4[3];
  }
  else {
    local_150 = *(ulong *)p_Var8;
    local_160.sa_handler = (__sighandler_t)*plVar4;
  }
  local_158 = (undefined1  [8])plVar4[1];
  *plVar4 = (long)p_Var8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 == paVar10) {
    local_b8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar5[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar5;
  }
  local_c0 = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_180 = &local_170;
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_170 = *plVar9;
    lStack_168 = plVar4[3];
  }
  else {
    local_170 = *plVar9;
    local_180 = (long *)*plVar4;
  }
  local_178 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != (__sighandler_t)&local_150) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    operator_delete(local_2b8.sa_handler,(ulong)(local_2a8.sa_handler + 1));
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_258.field_2._M_allocated_capacity = *puVar7;
    local_258.field_2._8_8_ = plVar4[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *puVar7;
    local_258._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_258._M_string_length = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_278.field_2._M_allocated_capacity = *puVar7;
    local_278.field_2._8_8_ = plVar4[3];
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar7;
    local_278._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_278._M_string_length = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_298._M_allocated_capacity = (size_type)&local_288;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar10) {
    local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_288._8_8_ = plVar4[3];
  }
  else {
    local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_298._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar4;
  }
  local_298._8_8_ = plVar4[1];
  *plVar4 = (long)paVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_298._M_local_buf);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_2e8 = *puVar7;
    lStack_2e0 = plVar4[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar7;
    local_2f8 = (ulong *)*plVar4;
  }
  local_2f0 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_308 = *puVar7;
    lStack_300 = plVar4[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar7;
    local_318 = (ulong *)*plVar4;
  }
  local_310 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  StreamableToString<int>(&local_1c8,&this->line_);
  uVar14 = 0xf;
  if (local_318 != &local_308) {
    uVar14 = local_308;
  }
  if (uVar14 < local_1c8._M_string_length + local_310) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      uVar15 = local_1c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_1c8._M_string_length + local_310) goto LAB_0013615c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_0013615c:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_1c8._M_dataplus._M_p);
  }
  puVar7 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar7) {
    local_2c8 = *puVar7;
    lStack_2c0 = puVar5[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar7;
    local_2d8 = (ulong *)*puVar5;
  }
  local_2d0 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)puVar7 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  p_Var13 = (_union_1457 *)(plVar4 + 2);
  if ((_union_1457 *)*plVar4 == p_Var13) {
    local_2a8.sa_handler = p_Var13->sa_handler;
    lStack_2a0 = plVar4[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8.sa_handler = p_Var13->sa_handler;
    local_2b8.sa_handler = (__sighandler_t)*plVar4;
  }
  local_2b0 = plVar4[1];
  *plVar4 = (long)p_Var13;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  StreamableToString<int>(&local_1e8,&local_20c);
  p_Var8 = (__sighandler_t)
           (CONCAT44(local_1e8._M_string_length._4_4_,(int)local_1e8._M_string_length) + local_2b0);
  _Var11 = (_union_1457)0xf;
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    _Var11 = local_2a8;
  }
  if ((ulong)_Var11 < p_Var8) {
    uVar15 = (__sighandler_t)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar15 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < p_Var8) goto LAB_0013626f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_2b8);
  }
  else {
LAB_0013626f:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_1e8._M_dataplus._M_p);
  }
  local_160.sa_handler = (__sighandler_t)&local_150;
  p_Var8 = (__sighandler_t)(puVar5 + 2);
  if ((__sighandler_t)*puVar5 == p_Var8) {
    local_150 = *(ulong *)p_Var8;
    uStack_148 = puVar5[3];
  }
  else {
    local_150 = *(ulong *)p_Var8;
    local_160.sa_handler = (__sighandler_t)*puVar5;
  }
  local_158 = (undefined1  [8])puVar5[1];
  *puVar5 = p_Var8;
  puVar5[1] = 0;
  *p_Var8 = (__sighandler_t)0x0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 == paVar10) {
    local_b8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar5[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar5;
  }
  local_c0 = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  StreamableToString<int>(&local_1a0,&local_234);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    uVar15 = local_b8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_c0 + local_1a0._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
        &local_1a0.field_2) {
      uVar15 = local_1a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_c0 + local_1a0._M_string_length) goto LAB_001363b8;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_001363b8:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_c8,
                        (ulong)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,
                                        local_1a0._M_dataplus._M_p._0_4_));
  }
  local_208 = &local_1f8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1f8 = *plVar4;
    uStack_1f0 = puVar5[3];
  }
  else {
    local_1f8 = *plVar4;
    local_208 = (long *)*puVar5;
  }
  local_200 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
      &local_1a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_),
                    local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != (__sighandler_t)&local_150) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,(ulong)(local_1e8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    operator_delete(local_2b8.sa_handler,(ulong)(local_2a8.sa_handler + 1));
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_1c8.field_2._M_allocated_capacity = 0;
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  local_1c8._M_string_length = 0;
  local_c8.sa_handler = (__sighandler_t)0x0;
  std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*>
            ((vector<char*,std::allocator<char*>> *)&local_1c8,(iterator)0x0,
             (char **)&local_c8.sa_handler);
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&g_argvs_abi_cxx11_;
  if (g_injected_test_argvs_abi_cxx11_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    __x = g_injected_test_argvs_abi_cxx11_;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_c8,__x);
  Arguments::AddArguments<std::__cxx11::string>
            ((Arguments *)&local_1c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c8);
  cVar16._M_current = (char **)(local_1c8._M_string_length - 8);
  local_c8.sa_handler = (__sighandler_t)strdup((char *)local_180);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1c8,cVar16,
             (value_type *)&local_c8.sa_handler);
  cVar16._M_current = (char **)(local_1c8._M_string_length - 8);
  local_c8.sa_handler = (__sighandler_t)strdup((char *)local_208);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1c8,cVar16,
             (value_type *)&local_c8.sa_handler);
  local_c8.sa_handler = (__sighandler_t)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  local_1e8._M_dataplus._M_p = local_1c8._M_dataplus._M_p;
  local_1e8._M_string_length._0_4_ = local_238;
  memset(&local_160,0,0x98);
  sigemptyset((sigset_t *)local_158);
  local_160 = (_union_1457)0x1;
  do {
    iVar2 = sigaction(0x1b,(sigaction *)&local_160,(sigaction *)&local_c8);
    if (iVar2 != -1) {
      if (FLAGS_gtest_death_test_use_fork != '\0') {
        iVar2 = fork();
        if (iVar2 == 0) {
          ExecDeathTestChildMain(&local_1e8);
          goto LAB_0013743e;
        }
LAB_00136881:
        goto LAB_00136889;
      }
      if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_0013743e:
        AssumeRole();
      }
      iVar2 = getpagesize();
      __len = (size_t)(iVar2 * 2);
      __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
      if (__addr == (void *)0xffffffffffffffff) {
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"CHECK failed: File ","");
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
        local_298._M_allocated_capacity = *puVar5;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_allocated_capacity == paVar10) {
          local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_288._8_8_ = puVar5[3];
          local_298._M_allocated_capacity = (size_type)&local_288;
        }
        else {
          local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
        }
        local_298._8_8_ = puVar5[1];
        *puVar5 = paVar10;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
        local_2f8 = (ulong *)*puVar5;
        puVar7 = puVar5 + 2;
        if (local_2f8 == puVar7) {
          local_2e8 = *puVar7;
          lStack_2e0 = puVar5[3];
          local_2f8 = &local_2e8;
        }
        else {
          local_2e8 = *puVar7;
        }
        local_2f0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        local_230._M_dataplus._M_p._0_4_ = 0x55b;
        StreamableToString<int>(&local_258,(int *)&local_230);
        uVar14 = 0xf;
        if (local_2f8 != &local_2e8) {
          uVar14 = local_2e8;
        }
        if (uVar14 < local_258._M_string_length + local_2f0) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            uVar15 = local_258.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_258._M_string_length + local_2f0) goto LAB_00137962;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
        }
        else {
LAB_00137962:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
        }
        local_318 = (ulong *)*puVar5;
        puVar7 = puVar5 + 2;
        if (local_318 == puVar7) {
          local_308 = *puVar7;
          lStack_300 = puVar5[3];
          local_318 = &local_308;
        }
        else {
          local_308 = *puVar7;
        }
        local_310 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
        local_2d8 = (ulong *)*puVar5;
        puVar7 = puVar5 + 2;
        if (local_2d8 == puVar7) {
          local_2c8 = *puVar7;
          lStack_2c0 = puVar5[3];
          local_2d8 = &local_2c8;
        }
        else {
          local_2c8 = *puVar7;
        }
        local_2d0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
      }
      else {
        lVar12 = 0;
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
          lVar12 = __len - 0x40;
        }
        if (((uint)(iVar2 * 2) < 0x41) || (((ulong)(lVar12 + (long)__addr) & 0x3f) != 0)) {
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"CHECK failed: File ","");
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          local_298._M_allocated_capacity = *puVar5;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_allocated_capacity == paVar10) {
            local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_288._8_8_ = puVar5[3];
            local_298._M_allocated_capacity = (size_type)&local_288;
          }
          else {
            local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_298._8_8_ = puVar5[1];
          *puVar5 = paVar10;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
          local_2f8 = (ulong *)*puVar5;
          puVar7 = puVar5 + 2;
          if (local_2f8 == puVar7) {
            local_2e8 = *puVar7;
            lStack_2e0 = puVar5[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8 = *puVar7;
          }
          local_2f0 = puVar5[1];
          *puVar5 = puVar7;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x569;
          StreamableToString<int>(&local_258,(int *)&local_230);
          uVar14 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar14 = local_2e8;
          }
          if (uVar14 < local_258._M_string_length + local_2f0) {
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              uVar15 = local_258.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_258._M_string_length + local_2f0) goto LAB_00137a6e;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8)
            ;
          }
          else {
LAB_00137a6e:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
          }
          local_318 = (ulong *)*puVar5;
          puVar7 = puVar5 + 2;
          if (local_318 == puVar7) {
            local_308 = *puVar7;
            lStack_300 = puVar5[3];
            local_318 = &local_308;
          }
          else {
            local_308 = *puVar7;
          }
          local_310 = puVar5[1];
          *puVar5 = puVar7;
          puVar5[1] = 0;
          *(undefined1 *)puVar7 = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
          local_2d8 = (ulong *)*puVar5;
          puVar7 = puVar5 + 2;
          if (local_2d8 == puVar7) {
            local_2c8 = *puVar7;
            lStack_2c0 = puVar5[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8 = *puVar7;
          }
          local_2d0 = puVar5[1];
          *puVar5 = puVar7;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
        }
        else {
          iVar2 = clone(ExecDeathTestChildMain,(void *)(lVar12 + (long)__addr),0x11,&local_1e8);
          iVar3 = munmap(__addr,__len);
          if (iVar3 != -1) goto LAB_00136881;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"CHECK failed: File ","");
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          local_298._M_allocated_capacity = *puVar5;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_allocated_capacity == paVar10) {
            local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_288._8_8_ = puVar5[3];
            local_298._M_allocated_capacity = (size_type)&local_288;
          }
          else {
            local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_298._8_8_ = puVar5[1];
          *puVar5 = paVar10;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
          local_2f8 = (ulong *)*puVar5;
          puVar7 = puVar5 + 2;
          if (local_2f8 == puVar7) {
            local_2e8 = *puVar7;
            lStack_2e0 = puVar5[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8 = *puVar7;
          }
          local_2f0 = puVar5[1];
          *puVar5 = puVar7;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x56d;
          StreamableToString<int>(&local_258,(int *)&local_230);
          uVar14 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar14 = local_2e8;
          }
          if (uVar14 < local_258._M_string_length + local_2f0) {
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              uVar15 = local_258.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_258._M_string_length + local_2f0) goto LAB_00137b7a;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8)
            ;
          }
          else {
LAB_00137b7a:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
          }
          local_318 = (ulong *)*puVar5;
          puVar7 = puVar5 + 2;
          if (local_318 == puVar7) {
            local_308 = *puVar7;
            lStack_300 = puVar5[3];
            local_318 = &local_308;
          }
          else {
            local_308 = *puVar7;
          }
          local_310 = puVar5[1];
          *puVar5 = puVar7;
          puVar5[1] = 0;
          *(undefined1 *)puVar7 = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
          local_2d8 = (ulong *)*puVar5;
          puVar7 = puVar5 + 2;
          if (local_2d8 == puVar7) {
            local_2c8 = *puVar7;
            lStack_2c0 = puVar5[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8 = *puVar7;
          }
          local_2d0 = puVar5[1];
          *puVar5 = puVar7;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
        }
      }
      goto LAB_00136f50;
    }
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)*plVar4;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)local_278._M_dataplus._M_p == puVar7) {
    local_278.field_2._M_allocated_capacity = *puVar7;
    local_278.field_2._8_8_ = plVar4[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar7;
  }
  local_278._M_string_length = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_298._M_allocated_capacity = *plVar4;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity == paVar10) {
    local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_288._8_8_ = plVar4[3];
    local_298._M_allocated_capacity = (size_type)&local_288;
  }
  else {
    local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_298._8_8_ = plVar4[1];
  *plVar4 = (long)paVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x54f;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    uVar15 = local_288._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_230._M_string_length + local_298._8_8_) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar15 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_230._M_string_length + local_298._8_8_) goto LAB_00136b31;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,local_298._M_allocated_capacity);
  }
  else {
LAB_00136b31:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_298._M_local_buf,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f8 = (ulong *)*puVar5;
  puVar7 = puVar5 + 2;
  if (local_2f8 == puVar7) {
    local_2e8 = *puVar7;
    lStack_2e0 = puVar5[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar7;
  }
  local_2f0 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)puVar7 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar5;
  puVar7 = puVar5 + 2;
  if (local_318 == puVar7) {
    local_308 = *puVar7;
    lStack_300 = puVar5[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar7;
  }
  local_310 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  goto LAB_00136ef5;
LAB_0013691e:
  do {
    iVar3 = close(local_234);
    if (iVar3 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar2;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_238;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_1c8);
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      return OVERSEE_TEST;
    }
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  local_298._M_allocated_capacity = (size_type)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CHECK failed: File ","");
  puVar5 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
  local_2f8 = (ulong *)*puVar5;
  puVar7 = puVar5 + 2;
  if (local_2f8 == puVar7) {
    local_2e8 = *puVar7;
    lStack_2e0 = puVar5[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar7;
  }
  local_2f0 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar5;
  puVar7 = puVar5 + 2;
  if (local_318 == puVar7) {
    local_308 = *puVar7;
    lStack_300 = puVar5[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar7;
  }
  local_310 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_258._M_dataplus._M_p._0_4_ = 0x5ac;
  StreamableToString<int>(&local_278,(int *)&local_258);
  uVar14 = 0xf;
  if (local_318 != &local_308) {
    uVar14 = local_308;
  }
  if (uVar14 < local_278._M_string_length + local_310) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      uVar15 = local_278.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_278._M_string_length + local_310) goto LAB_00136d61;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_00136d61:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_278._M_dataplus._M_p);
  }
  local_2d8 = (ulong *)*puVar5;
  puVar7 = puVar5 + 2;
  if (local_2d8 == puVar7) {
    local_2c8 = *puVar7;
    lStack_2c0 = puVar5[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar7;
  }
  local_2d0 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)puVar7 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8.sa_handler = (__sighandler_t)*puVar5;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.sa_handler == paVar10) {
    local_2a8 = (_union_1457)paVar10->_M_allocated_capacity;
    lStack_2a0 = puVar5[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = (_union_1457)paVar10->_M_allocated_capacity;
  }
  local_2b0 = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_160.sa_handler = (__sighandler_t)*plVar4;
  p_Var8 = (__sighandler_t)(plVar4 + 2);
  if (local_160.sa_handler == p_Var8) {
    local_150 = *(ulong *)p_Var8;
    uStack_148 = plVar4[3];
    local_160.sa_handler = (__sighandler_t)&local_150;
  }
  else {
    local_150 = *(ulong *)p_Var8;
  }
  local_158 = (undefined1  [8])plVar4[1];
  *plVar4 = (long)p_Var8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  local_c8.sa_handler = (__sighandler_t)*puVar5;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler == paVar10) {
    local_b8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar5[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
LAB_001370f6:
    local_b8[0]._0_8_ = paVar10->_M_allocated_capacity;
  }
LAB_00137101:
  _Var11 = *(_union_1457 *)(puVar5 + 1);
  p_Var13 = &local_c8;
  goto LAB_0013710d;
  while (piVar6 = __errno_location(), *piVar6 == 4) {
LAB_00136889:
    iVar3 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)0x0);
    if (iVar3 != -1) {
      if (iVar2 != -1) goto LAB_0013691e;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CHECK failed: File ","")
      ;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
      local_298._M_allocated_capacity = *puVar5;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity == paVar10) {
        local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_288._8_8_ = puVar5[3];
        local_298._M_allocated_capacity = (size_type)&local_288;
      }
      else {
        local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_298._8_8_ = puVar5[1];
      *puVar5 = paVar10;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
      local_2f8 = (ulong *)*puVar5;
      puVar7 = puVar5 + 2;
      if (local_2f8 == puVar7) {
        local_2e8 = *puVar7;
        lStack_2e0 = puVar5[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8 = *puVar7;
      }
      local_2f0 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      local_230._M_dataplus._M_p._0_4_ = 0x57d;
      StreamableToString<int>(&local_258,(int *)&local_230);
      uVar14 = 0xf;
      if (local_2f8 != &local_2e8) {
        uVar14 = local_2e8;
      }
      if (uVar14 < local_258._M_string_length + local_2f0) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          uVar15 = local_258.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_258._M_string_length + local_2f0) goto LAB_0013768f;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
      }
      else {
LAB_0013768f:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
      }
      local_318 = (ulong *)*puVar5;
      puVar7 = puVar5 + 2;
      if (local_318 == puVar7) {
        local_308 = *puVar7;
        lStack_300 = puVar5[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *puVar7;
      }
      local_310 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)puVar7 = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
      local_2d8 = (ulong *)*puVar5;
      puVar7 = puVar5 + 2;
      if (local_2d8 == puVar7) {
        local_2c8 = *puVar7;
        lStack_2c0 = puVar5[3];
        local_2d8 = &local_2c8;
      }
      else {
        local_2c8 = *puVar7;
      }
      local_2d0 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      goto LAB_00136f50;
    }
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)*puVar5;
  puVar7 = puVar5 + 2;
  if ((ulong *)local_278._M_dataplus._M_p == puVar7) {
    local_278.field_2._M_allocated_capacity = *puVar7;
    local_278.field_2._8_8_ = puVar5[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar7;
  }
  local_278._M_string_length = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
  local_298._M_allocated_capacity = *puVar5;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity == paVar10) {
    local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_288._8_8_ = puVar5[3];
    local_298._M_allocated_capacity = (size_type)&local_288;
  }
  else {
    local_288._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_298._8_8_ = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x57a;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    uVar15 = local_288._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_230._M_string_length + local_298._8_8_) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar15 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_230._M_string_length + local_298._8_8_) goto LAB_00136c5e;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,local_298._M_allocated_capacity);
  }
  else {
LAB_00136c5e:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_298._M_local_buf,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f8 = (ulong *)*puVar5;
  puVar7 = puVar5 + 2;
  if (local_2f8 == puVar7) {
    local_2e8 = *puVar7;
    lStack_2e0 = puVar5[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar7;
  }
  local_2f0 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)puVar7 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar5;
  puVar7 = puVar5 + 2;
  if (local_318 == puVar7) {
    local_308 = *puVar7;
    lStack_300 = puVar5[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar7;
  }
  local_310 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
LAB_00136ef5:
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
  local_2d8 = (ulong *)*puVar5;
  puVar7 = puVar5 + 2;
  if (local_2d8 == puVar7) {
    local_2c8 = *puVar7;
    lStack_2c0 = puVar5[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar7;
  }
  local_2d0 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
LAB_00136f50:
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8.sa_handler = (__sighandler_t)*puVar5;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.sa_handler == paVar10) {
    local_2a8 = (_union_1457)paVar10->_M_allocated_capacity;
    lStack_2a0 = puVar5[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = (_union_1457)paVar10->_M_allocated_capacity;
  }
  _Var11 = *(_union_1457 *)(puVar5 + 1);
  p_Var13 = &local_2b8;
LAB_0013710d:
  p_Var13[1] = _Var11;
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DeathTestAbort((string *)p_Var13);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}